

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

unsigned_long capnp::(anonymous_namespace)::checkRoundTrip<unsigned_long,double>(double value)

{
  ulong uVar1;
  double in_XMM0_Qa;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 local_10 [8];
  
  uVar1 = (long)(in_XMM0_Qa - 9.223372036854776e+18) & (long)in_XMM0_Qa >> 0x3f | (long)in_XMM0_Qa;
  auVar2._8_4_ = (int)(uVar1 >> 0x20);
  auVar2._0_8_ = uVar1;
  auVar2._12_4_ = 0x45300000;
  dVar3 = (auVar2._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  if ((dVar3 != in_XMM0_Qa) || (NAN(dVar3) || NAN(in_XMM0_Qa))) {
    checkRoundTrip<unsigned_long,double>(local_10);
  }
  return uVar1;
}

Assistant:

T checkRoundTrip(U value) {
#if __aarch64__
  // Work around an apparently broken compiler optimization on Clang / arm64. It appears that
  // for T = int8_t, U = double, and value = 128, the compiler incorrectly believes that the
  // round-trip does not change the value, where in fact it should change to -128. Similar problems
  // exist for various other types and inputs -- json-test seems to exercise several problem cases.
  // The problem only exists when compiling with optimization. In any case, declaring the variable
  // `volatile` kills the optimization.
  volatile
#endif
  T result = value;
  KJ_REQUIRE(U(result) == value, "Value out-of-range for requested type.", value) {
    // Use it anyway.
    break;
  }
  return result;
}